

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O0

bool WriteFakeManifests(string *dir,string *err)

{
  TimeStamp TVar1;
  char *__command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  undefined1 local_80 [4];
  int exit_code;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TimeStamp local_30;
  TimeStamp mtime;
  RealDiskInterface disk_interface;
  string *err_local;
  string *dir_local;
  
  disk_interface.super_DiskInterface.super_FileReader._vptr_FileReader =
       (DiskInterface)(DiskInterface)err;
  RealDiskInterface::RealDiskInterface((RealDiskInterface *)&mtime);
  std::operator+(&local_50,dir,"/build.ninja");
  TVar1 = RealDiskInterface::Stat
                    ((RealDiskInterface *)&mtime,&local_50,
                     (string *)disk_interface.super_DiskInterface.super_FileReader._vptr_FileReader)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = TVar1;
  if (TVar1 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "python misc/write_fake_manifests.py ",dir);
    printf("Creating manifest data...");
    fflush(_stdout);
    __command = (char *)std::__cxx11::string::c_str();
    local_84 = system(__command);
    printf("done.\n");
    if (local_84 != 0) {
      std::operator+(&local_a8,"Failed to run ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::__cxx11::string::operator=
                ((string *)disk_interface.super_DiskInterface.super_FileReader._vptr_FileReader,
                 (string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    dir_local._7_1_ = local_84 == 0;
    command.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    dir_local._7_1_ = TVar1 != -1;
    command.field_2._8_4_ = 1;
  }
  RealDiskInterface::~RealDiskInterface((RealDiskInterface *)&mtime);
  return dir_local._7_1_;
}

Assistant:

bool WriteFakeManifests(const string& dir, string* err) {
  RealDiskInterface disk_interface;
  TimeStamp mtime = disk_interface.Stat(dir + "/build.ninja", err);
  if (mtime != 0)  // 0 means that the file doesn't exist yet.
    return mtime != -1;

  string command = "python misc/write_fake_manifests.py " + dir;
  printf("Creating manifest data..."); fflush(stdout);
  int exit_code = system(command.c_str());
  printf("done.\n");
  if (exit_code != 0)
    *err = "Failed to run " + command;
  return exit_code == 0;
}